

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.h
# Opt level: O2

string * prometheus::detail::base64_encode(string *__return_storage_ptr__,string *input)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (uVar3 = 0; uVar1 = input->_M_string_length % 3, uVar3 < input->_M_string_length / 3;
      uVar3 = uVar3 + 1) {
    ::std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    ::std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    ::std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    ::std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  }
  if (uVar1 == 1) {
    ::std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    ::std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    cVar2 = '\x02';
  }
  else {
    if (uVar1 != 2) {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    cVar2 = '\x01';
    ::std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    ::std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  }
  ::std::__cxx11::string::append((ulong)__return_storage_ptr__,cVar2);
  return __return_storage_ptr__;
}

Assistant:

inline std::string base64_encode(const std::string& input) {
  std::string encoded;
  encoded.reserve(((input.size() / 3) + (input.size() % 3 > 0)) * 4);

  std::uint32_t temp{};
  auto it = input.begin();

  for (std::size_t i = 0; i < input.size() / 3; ++i) {
    temp = static_cast<std::uint8_t>(*it++) << 16;
    temp += static_cast<std::uint8_t>(*it++) << 8;
    temp += static_cast<std::uint8_t>(*it++);
    encoded.append(1, kEncodeLookup[(temp & 0x00FC0000) >> 18]);
    encoded.append(1, kEncodeLookup[(temp & 0x0003F000) >> 12]);
    encoded.append(1, kEncodeLookup[(temp & 0x00000FC0) >> 6]);
    encoded.append(1, kEncodeLookup[(temp & 0x0000003F)]);
  }

  switch (input.size() % 3) {
    case 1:
      temp = static_cast<std::uint8_t>(*it++) << 16;
      encoded.append(1, kEncodeLookup[(temp & 0x00FC0000) >> 18]);
      encoded.append(1, kEncodeLookup[(temp & 0x0003F000) >> 12]);
      encoded.append(2, kPadCharacter);
      break;
    case 2:
      temp = static_cast<std::uint8_t>(*it++) << 16;
      temp += static_cast<std::uint8_t>(*it++) << 8;
      encoded.append(1, kEncodeLookup[(temp & 0x00FC0000) >> 18]);
      encoded.append(1, kEncodeLookup[(temp & 0x0003F000) >> 12]);
      encoded.append(1, kEncodeLookup[(temp & 0x00000FC0) >> 6]);
      encoded.append(1, kPadCharacter);
      break;
  }

  return encoded;
}